

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

int Saig_ObjCexMinGet0Fanin0(Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  uint uVar3;
  
  pAVar1 = pObj->pFanin0;
  uVar3 = (uint)*(undefined8 *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 0x30;
  if ((uVar3 == 0x20 & (byte)pAVar1) == 0) {
    uVar2 = 0;
    if (uVar3 == 0x10) {
      uVar2 = ~(uint)pAVar1 & 1;
    }
    return uVar2;
  }
  return 1;
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjFanin0( Aig_Obj_t * pObj )      { return Aig_Regular(pObj->pFanin0);             }